

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_clear_without_containers(roaring_array_t *ra)

{
  free(ra->containers);
  ra->keys = (uint16_t *)0x0;
  ra->typecodes = (uint8_t *)0x0;
  ra->size = 0;
  ra->allocation_size = 0;
  ra->containers = (void **)0x0;
  return;
}

Assistant:

void ra_clear_without_containers(roaring_array_t *ra) {
    free(ra->containers);    // keys and typecodes are allocated with containers
    ra->size = 0;
    ra->allocation_size = 0;
    ra->containers = NULL;
    ra->keys = NULL;
    ra->typecodes = NULL;
}